

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdeclnode.cpp
# Opt level: O3

void __thiscall FuncDeclNode::print(FuncDeclNode *this)

{
  pointer puVar1;
  ostream *poVar2;
  iterator __begin2;
  pointer puVar3;
  
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,";",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[label=\"FuncDecl\\nname=",0x17);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"];",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  puVar1 = (this->args).
           super__Vector_base<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->args).
                super__Vector_base<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar1 != puVar3; puVar3 = puVar3 + 1) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"--",2);
    (**(code **)(*(long *)&(((puVar3->_M_t).
                             super___uniq_ptr_impl<ArgNode,_std::default_delete<ArgNode>_>._M_t.
                             super__Tuple_impl<0UL,_ArgNode_*,_std::default_delete<ArgNode>_>.
                             super__Head_base<0UL,_ArgNode_*,_false>._M_head_impl)->super_VarNode).
                           super_ASTNode + 0x20))();
  }
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"--",2);
  (**(code **)((long)(((this->returnType)._M_t.
                       super___uniq_ptr_impl<TypeNode,_std::default_delete<TypeNode>_>._M_t.
                       super__Tuple_impl<0UL,_TypeNode_*,_std::default_delete<TypeNode>_>.
                       super__Head_base<0UL,_TypeNode_*,_false>._M_head_impl)->super_ASTNode).
                     _vptr_ASTNode + 0x20))();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"--",2);
  (**(code **)((long)(((this->body)._M_t.
                       super___uniq_ptr_impl<SequenceNode,_std::default_delete<SequenceNode>_>._M_t.
                       super__Tuple_impl<0UL,_SequenceNode_*,_std::default_delete<SequenceNode>_>.
                       super__Head_base<0UL,_SequenceNode_*,_false>._M_head_impl)->super_ASTNode).
                     _vptr_ASTNode + 0x20))();
  return;
}

Assistant:

void FuncDeclNode::print() {
    std::cout << currentNode << ";" << std::endl;
    std::cout << currentNode << "[label=\"FuncDecl\\nname=" << name << "\"];" << std::endl;


    if (args.size() > 0) {
        for (const auto& a : args) {
            std::cout << currentNode << "--"; a->print();
        }
    }

    std::cout << currentNode << "--"; returnType->print();
    std::cout << currentNode << "--"; body->print();
}